

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_basics.cpp
# Opt level: O0

void test_1d_static<1ul>(void)

{
  int iVar1;
  ulong uVar2;
  value_type vVar3;
  size_type sVar4;
  int *local_60;
  int *local_58;
  size_type local_50;
  int local_48;
  int local_44;
  int i;
  int dptr [1];
  size_type local_38;
  unsigned_long local_30;
  size_type local_28;
  int local_1c;
  size_type local_18;
  bool local_d;
  bool local_c;
  layout_mapping_right<std::experimental::dimensions<1UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
  local_b [2];
  layout_mapping_right<std::experimental::dimensions<1UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
  l;
  
  std::experimental::
  layout_mapping_right<std::experimental::dimensions<1UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
  ::layout_mapping_right(local_b);
  local_c = std::experimental::
            layout_mapping_right<std::experimental::dimensions<1UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
            ::is_regular();
  local_d = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x1d,"void test_1d_static() [X = 1UL]",&local_c,&local_d);
  local_18 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<1UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
             ::stride(local_b,0);
  local_1c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x1f,"void test_1d_static() [X = 1UL]",&local_18,&local_1c);
  local_28 = std::experimental::dimensions<1UL>::size((dimensions<1UL> *)local_b);
  local_30 = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x21,"void test_1d_static() [X = 1UL]",&local_28,&local_30);
  local_38 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<1UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
             ::span(local_b);
  _i = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x22,"void test_1d_static() [X = 1UL]",&local_38,(unsigned_long *)&i);
  local_48 = 0;
  while( true ) {
    uVar2 = (ulong)local_48;
    vVar3 = std::experimental::dimensions<1UL>::operator[]<int>((dimensions<1UL> *)local_b,0);
    if (vVar3 <= uVar2) break;
    local_50 = std::experimental::
               layout_mapping_right<std::experimental::dimensions<1UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
               ::index<int>(local_b,local_48);
    boost::detail::test_eq_impl<unsigned_long,int>
              ("(l.index(i))","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
               ,0x29,"void test_1d_static() [X = 1UL]",&local_50,&local_48);
    sVar4 = std::experimental::
            layout_mapping_right<std::experimental::dimensions<1UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
            ::index<int>(local_b,local_48);
    local_58 = &local_44 + sVar4;
    local_60 = &local_44 + local_48;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i)])","&(dptr[i])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
               ,0x2b,"void test_1d_static() [X = 1UL]",&local_58,&local_60);
    iVar1 = local_48;
    sVar4 = std::experimental::
            layout_mapping_right<std::experimental::dimensions<1UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
            ::index<int>(local_b,local_48);
    (&local_44)[sVar4] = iVar1;
    sVar4 = std::experimental::
            layout_mapping_right<std::experimental::dimensions<1UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
            ::index<int>(local_b,local_48);
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i)])","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
               ,0x2f,"void test_1d_static() [X = 1UL]",&local_44 + sVar4,&local_48);
    local_48 = local_48 + 1;
  }
  return;
}

Assistant:

void test_1d_static()
{ // {{{
    layout_mapping_right<
        dimensions<X>, dimensions<1>, dimensions<0>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);

    BOOST_TEST_EQ((l.size()), X);
    BOOST_TEST_EQ((l.span()), X);

    int dptr[X];

    // Set all elements to a unique value.
    for (auto i = 0; i < l[0]; ++i)
    {
        BOOST_TEST_EQ((l.index(i)), i);

        BOOST_TEST_EQ(&(dptr[l.index(i)]), &(dptr[i])); 

        dptr[l.index(i)] = i;

        BOOST_TEST_EQ((dptr[l.index(i)]), i); 
    }
}